

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

Applicator * __thiscall
Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::GenMatcher::Substitution::
getApplicator(Substitution *this)

{
  long lVar1;
  GenMatcher *parent;
  Applicator *in_RDI;
  
  lVar1._0_4_ = (in_RDI->_cache)._deleted;
  lVar1._4_4_ = (in_RDI->_cache)._capacityIndex;
  if (lVar1 == 0) {
    parent = (GenMatcher *)
             SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::GenMatcher::Applicator::
             operator_new(0x588a24);
    GenMatcher::Applicator::Applicator(in_RDI,parent,(Renaming *)0x588a40);
    *(GenMatcher **)&(in_RDI->_cache)._deleted = parent;
  }
  return *(Applicator **)&(in_RDI->_cache)._deleted;
}

Assistant:

Applicator* getApplicator()
  {
    if(!_applicator) {
      _applicator=new Applicator(_parent, _resultNormalizer);
    }
    return _applicator;
  }